

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O2

UTrie2 * utrie2_open_63(uint32_t initialValue,uint32_t errorValue,UErrorCode *pErrorCode)

{
  UTrie2 *trie;
  UNewTrie2 *buffer;
  uint32_t *buffer_00;
  long lVar1;
  int32_t *piVar2;
  UNewTrie2 *pUVar3;
  uint c;
  
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    trie = (UTrie2 *)uprv_malloc_63(0x50);
    buffer = (UNewTrie2 *)uprv_malloc_63(0x453c0);
    buffer_00 = (uint32_t *)uprv_malloc_63(0x10000);
    if ((buffer != (UNewTrie2 *)0x0 && trie != (UTrie2 *)0x0) && buffer_00 != (uint32_t *)0x0) {
      trie->index2NullOffset = 0;
      trie->dataNullOffset = 0;
      trie->initialValue = 0;
      trie->errorValue = 0;
      trie->highStart = 0;
      *(undefined8 *)&trie->highValueIndex = 0;
      trie->memory = (void *)0x0;
      trie->data32 = (uint32_t *)0x0;
      trie->indexLength = 0;
      trie->dataLength = 0;
      trie->length = 0;
      trie->isMemoryOwned = '\0';
      trie->padding1 = '\0';
      trie->padding2 = 0;
      trie->index = (uint16_t *)0x0;
      trie->data16 = (uint16_t *)0x0;
      trie->initialValue = initialValue;
      trie->errorValue = errorValue;
      buffer->data = buffer_00;
      buffer->dataCapacity = 0x4000;
      buffer->initialValue = initialValue;
      buffer->errorValue = errorValue;
      buffer->highStart = 0x110000;
      buffer->firstFreeBlock = 0;
      trie->highStart = 0x110000;
      trie->newTrie = buffer;
      buffer->isCompacted = '\0';
      for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 1) {
        buffer_00[lVar1] = initialValue;
      }
      for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
        buffer_00[lVar1 + 0x80] = errorValue;
      }
      for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
        buffer_00[lVar1 + 0xc0] = initialValue;
      }
      buffer->dataNullOffset = 0xc0;
      buffer->dataLength = 0x100;
      piVar2 = buffer->index2;
      for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 0x20) {
        *piVar2 = (int32_t)lVar1;
        piVar2[0x8aac] = 1;
        piVar2 = piVar2 + 1;
      }
      buffer->map[4] = 0;
      buffer->map[5] = 0;
      buffer->map[6] = 0x881d;
      buffer->map[7] = 0;
      for (lVar1 = 0x224; lVar1 != 0xa40; lVar1 = lVar1 + 1) {
        buffer->index1[lVar1] = 0xc0;
      }
      for (lVar1 = 0; lVar1 != 0x240; lVar1 = lVar1 + 1) {
        buffer->index2[lVar1 + 0x820] = -1;
      }
      for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
        buffer->index2[lVar1 + 0xa60] = 0xc0;
      }
      buffer->index2NullOffset = 0xa60;
      buffer->index2Length = 0xaa0;
      pUVar3 = buffer;
      for (lVar1 = 0; lVar1 != 0x800; lVar1 = lVar1 + 0x40) {
        pUVar3->index1[0] = (int32_t)lVar1;
        pUVar3 = (UNewTrie2 *)(pUVar3->index1 + 1);
      }
      for (lVar1 = 0; lVar1 != 0x200; lVar1 = lVar1 + 1) {
        buffer->index1[lVar1 + 0x20] = 0xa60;
      }
      for (c = 0x80; c < 0x800; c = c + 0x20) {
        utrie2_set32_63(trie,c,initialValue,pErrorCode);
      }
      return trie;
    }
    uprv_free_63(trie);
    uprv_free_63(buffer);
    uprv_free_63(buffer_00);
    *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
  }
  return (UTrie2 *)0x0;
}

Assistant:

U_CAPI void U_EXPORT2
utrie2_set32ForLeadSurrogateCodeUnit(UTrie2 *trie,
                                     UChar32 c, uint32_t value,
                                     UErrorCode *pErrorCode) {
    if(U_FAILURE(*pErrorCode)) {
        return;
    }
    if(!U_IS_LEAD(c)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    set32(trie->newTrie, c, FALSE, value, pErrorCode);
}